

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

void __thiscall
QVLABase<QList<int>_>::resize_impl
          (QVLABase<QList<int>_> *this,qsizetype prealloc,void *array,qsizetype sz)

{
  QVLABase<QList<int>_> *this_00;
  size_type sVar1;
  long in_RCX;
  void *in_RSI;
  QVLABaseBase *in_RDI;
  long in_FS_OFFSET;
  qsizetype unaff_retaddr;
  qsizetype in_stack_00000008;
  QVLABaseBase *prealloc_00;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  prealloc_00 = in_RDI;
  local_10 = in_RCX;
  this_00 = (QVLABase<QList<int>_> *)QVLABaseBase::capacity(in_RDI);
  qMax<long_long>(&local_10,(longlong *)&stack0xffffffffffffffe8);
  reallocate_impl(this_00,(qsizetype)prealloc_00,in_RSI,in_stack_00000008,unaff_retaddr);
  while( true ) {
    sVar1 = QVLABaseBase::size(in_RDI);
    if (local_10 <= sVar1) break;
    data((QVLABase<QList<int>_> *)in_RDI);
    QVLABaseBase::size(in_RDI);
    q20::construct_at<QList<int>,,void>((QList<int> *)in_RDI);
    in_RDI->s = in_RDI->s + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void resize_impl(qsizetype prealloc, void *array, qsizetype sz)
    {
        reallocate_impl(prealloc, array, sz, qMax(sz, capacity()));
        if constexpr (QTypeInfo<T>::isComplex) {
            // call default constructor for new objects (which can throw)
            while (size() < sz) {
                q20::construct_at(data() + size());
                ++s;
            }
        } else {
            s = sz;
        }
    }